

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O3

bool bssl::set_version_bound(SSL_PROTOCOL_METHOD *method,uint16_t *out,uint16_t version)

{
  uint16_t *puVar1;
  bool bVar2;
  undefined2 *puVar3;
  long lVar4;
  uint16_t unused;
  uint16_t local_1a;
  
  bVar2 = ssl_protocol_version_from_wire(&local_1a,version);
  if (bVar2) {
    puVar3 = &kTLSVersions;
    if (method->is_dtls != false) {
      puVar3 = &kDTLSVersions;
    }
    lVar4 = 0;
    do {
      puVar1 = (uint16_t *)((long)puVar3 + lVar4);
      if (*puVar1 == version) break;
      bVar2 = (ulong)(4 - method->is_dtls) * 2 + -2 != lVar4;
      lVar4 = lVar4 + 2;
    } while (bVar2);
    if (*puVar1 == version) {
      *out = version;
      return true;
    }
  }
  ERR_put_error(0x10,0,0xea,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                ,0x89);
  return false;
}

Assistant:

static bool set_version_bound(const SSL_PROTOCOL_METHOD *method, uint16_t *out,
                              uint16_t version) {
  if (!api_version_to_wire(&version, version) ||
      !ssl_method_supports_version(method, version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_SSL_VERSION);
    return false;
  }

  *out = version;
  return true;
}